

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_enter_user_frame_ptr(flatcc_builder_t *B,size_t size)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  size_t *psVar4;
  ulong uVar5;
  size_t __n;
  
  uVar5 = size + 7 & 0xfffffffffffffff8;
  sVar1 = B->user_frame_end;
  uVar3 = sVar1 + uVar5 + 8;
  if (B->buffers[7].iov_len < uVar3) {
    iVar2 = (*B->alloc)(B->alloc_context,B->buffers + 7,uVar3,0,7);
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
    }
  }
  psVar4 = (size_t *)(sVar1 + (long)B->buffers[7].iov_base);
  if (psVar4 == (size_t *)0x0) {
    psVar4 = (size_t *)0x0;
  }
  else {
    __n = uVar5 + 8;
    memset(psVar4,0,__n);
    *psVar4 = B->user_frame_offset;
    psVar4 = psVar4 + 1;
    B->user_frame_offset = B->user_frame_end + 8;
    B->user_frame_end = __n + B->user_frame_end;
  }
  return psVar4;
}

Assistant:

void *flatcc_builder_enter_user_frame_ptr(flatcc_builder_t *B, size_t size)
{
    size_t *frame;

    size = alignup_size(size, sizeof(size_t)) + sizeof(size_t);

    if (!(frame = reserve_buffer(B, flatcc_builder_alloc_us, B->user_frame_end, size, 0))) {
        return 0;
    }
    memset(frame, 0, size);
    *frame++ = B->user_frame_offset;
    B->user_frame_offset = B->user_frame_end + sizeof(size_t);
    B->user_frame_end += size;
    return frame;
}